

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O0

idx_t __thiscall
duckdb::StrfTimeFormat::GetLength(StrfTimeFormat *this,date_t date,int32_t *data,char *tz_name)

{
  bool bVar1;
  idx_t iVar2;
  undefined4 in_ESI;
  vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_> *in_RDI;
  StrTimeSpecifier *specifier;
  const_iterator __end2;
  const_iterator __begin2;
  vector<duckdb::StrTimeSpecifier,_true> *__range2;
  idx_t size;
  char *in_stack_00000078;
  int32_t *in_stack_00000080;
  StrTimeSpecifier in_stack_0000008b;
  date_t in_stack_0000008c;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<const_duckdb::StrTimeSpecifier_*,_std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>_>
  local_38;
  vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_> *local_30;
  pointer local_28;
  undefined4 local_4;
  
  local_28 = in_RDI[3].
             super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_4 = in_ESI;
  bVar1 = ::std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::empty
                    (in_stack_ffffffffffffffc0);
  if (!bVar1) {
    local_30 = in_RDI + 5;
    local_38._M_current =
         (StrTimeSpecifier *)
         ::std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::begin
                   (in_RDI);
    ::std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::end(in_RDI);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_duckdb::StrTimeSpecifier_*,_std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>_>
                               *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              (__normal_iterator<const_duckdb::StrTimeSpecifier_*,_std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>_>
                               *)in_RDI), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_duckdb::StrTimeSpecifier_*,_std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>_>
      ::operator*(&local_38);
      in_stack_ffffffffffffffb4 = local_4;
      iVar2 = GetSpecifierLength(in_stack_0000008b,in_stack_0000008c,in_stack_00000080,
                                 in_stack_00000078);
      local_28 = local_28 + iVar2;
      __gnu_cxx::
      __normal_iterator<const_duckdb::StrTimeSpecifier_*,_std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>_>
      ::operator++(&local_38);
    }
  }
  return (idx_t)local_28;
}

Assistant:

idx_t StrfTimeFormat::GetLength(date_t date, int32_t data[8], const char *tz_name) const {
	idx_t size = constant_size;
	if (!var_length_specifiers.empty()) {
		for (auto &specifier : var_length_specifiers) {
			size += GetSpecifierLength(specifier, date, data, tz_name);
		}
	}
	return size;
}